

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
 __thiscall
duckdb::Connection::Query
          (Connection *this,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement)

{
  ClientContext *statement_00;
  undefined8 *in_RDX;
  long *local_20;
  element_type *local_18;
  
  statement_00 = shared_ptr<duckdb::ClientContext,_true>::operator->
                           ((shared_ptr<duckdb::ClientContext,_true> *)statement);
  local_20 = (long *)*in_RDX;
  *in_RDX = 0;
  ClientContext::Query
            ((ClientContext *)&stack0xffffffffffffffe8,
             (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             statement_00,SUB81(&local_20,0));
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 8))();
  }
  (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_18;
  return (unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
          )(unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
            )this;
}

Assistant:

unique_ptr<MaterializedQueryResult> Connection::Query(unique_ptr<SQLStatement> statement) {
	auto result = context->Query(std::move(statement), false);
	D_ASSERT(result->type == QueryResultType::MATERIALIZED_RESULT);
	return unique_ptr_cast<QueryResult, MaterializedQueryResult>(std::move(result));
}